

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_AActor_A_DeQueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  DThinker *pDVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  char *__assertion;
  bool bVar6;
  TThinkerIterator<DCorpsePointer> iterator;
  FThinkerIterator FStack_28;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004b24f5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004b24e5:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004b24f5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x142,
                  "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pp_Var5 = (_func_int **)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pp_Var5 != (_func_int **)0x0) {
      pPVar2 = (PClass *)pp_Var5[1];
      if (pPVar2 == (PClass *)0x0) {
        pPVar2 = (PClass *)(**(code **)*pp_Var5)(pp_Var5);
        pp_Var5[1] = (_func_int *)pPVar2;
      }
      bVar6 = pPVar2 != (PClass *)0x0;
      if (pPVar2 != pPVar1 && bVar6) {
        do {
          pPVar2 = pPVar2->ParentClass;
          bVar6 = pPVar2 != (PClass *)0x0;
          if (pPVar2 == pPVar1) break;
        } while (pPVar2 != (PClass *)0x0);
      }
      if (!bVar6) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004b24f5;
      }
      goto LAB_004b2486;
    }
  }
  else if (pp_Var5 != (_func_int **)0x0) goto LAB_004b24e5;
  pp_Var5 = (_func_int **)0x0;
LAB_004b2486:
  FThinkerIterator::FThinkerIterator(&FStack_28,DCorpsePointer::RegistrationInfo.MyClass,3);
  do {
    pDVar3 = FThinkerIterator::Next(&FStack_28,false);
    if (pDVar3 == (DThinker *)0x0) {
      return 0;
    }
    pp_Var4 = pDVar3[1].super_DObject._vptr_DObject;
    if (pp_Var4 == (_func_int **)0x0) {
LAB_004b24c3:
      pp_Var4 = (_func_int **)0x0;
    }
    else if (((ulong)pp_Var4[4] & 0x20) != 0) {
      pDVar3[1].super_DObject._vptr_DObject = (_func_int **)0x0;
      goto LAB_004b24c3;
    }
    if (pp_Var4 == pp_Var5) {
      pDVar3[1].super_DObject._vptr_DObject = (_func_int **)0x0;
      (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
      return 0;
    }
  } while( true );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DeQueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *corpsePtr;

	while ((corpsePtr = iterator.Next()) != NULL)
	{
		if (corpsePtr->Corpse == self)
		{
			corpsePtr->Corpse = NULL;
			corpsePtr->Destroy ();
			return 0;
		}
	}
	return 0;
}